

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_table_iterators.h
# Opt level: O1

void __thiscall
draco::VertexRingIterator<draco::CornerTable>::Next(VertexRingIterator<draco::CornerTable> *this)

{
  uint uVar1;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> IVar2;
  uint uVar3;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> IVar4;
  
  IVar4.value_ = (this->corner_).value_;
  if (this->left_traversal_ == true) {
    IVar2.value_ = IVar4.value_;
    if (IVar4.value_ != 0xffffffff) {
      IVar2.value_ = IVar4.value_ - 2;
      if (0x55555555 < (IVar4.value_ + 1) * -0x55555555) {
        IVar2.value_ = IVar4.value_ + 1;
      }
    }
    if (IVar2.value_ != 0xffffffff) {
      IVar2.value_ = (this->corner_table_->opposite_corners_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[IVar2.value_].value_;
    }
    uVar3 = IVar2.value_;
    if (IVar2.value_ != 0xffffffff) {
      uVar3 = IVar2.value_ - 2;
      if (0x55555555 < (IVar2.value_ + 1) * -0x55555555) {
        uVar3 = IVar2.value_ + 1;
      }
    }
    (this->corner_).value_ = uVar3;
    uVar1 = (this->start_corner_).value_;
    if (uVar3 == 0xffffffff) {
      (this->corner_).value_ = uVar1;
      this->left_traversal_ = false;
      return;
    }
    if (uVar3 == uVar1) {
      (this->corner_).value_ = 0xffffffff;
      return;
    }
  }
  else {
    if (IVar4.value_ != 0xffffffff) {
      IVar4.value_ = ((IVar4.value_ * -0x55555555 < 0x55555556) - 1 | 2) + IVar4.value_;
    }
    if (IVar4.value_ != 0xffffffff) {
      IVar4.value_ = (this->corner_table_->opposite_corners_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[IVar4.value_].value_;
    }
    if (IVar4.value_ != 0xffffffff) {
      IVar4.value_ = ((IVar4.value_ * -0x55555555 < 0x55555556) - 1 | 2) + IVar4.value_;
    }
    (this->corner_).value_ = IVar4.value_;
  }
  return;
}

Assistant:

void Next() {
    if (left_traversal_) {
      corner_ = corner_table_->SwingLeft(corner_);
      if (corner_ == kInvalidCornerIndex) {
        // Open boundary reached.
        corner_ = start_corner_;
        left_traversal_ = false;
      } else if (corner_ == start_corner_) {
        // End reached.
        corner_ = kInvalidCornerIndex;
      }
    } else {
      // Go to the right until we reach a boundary there (no explicit check
      // is needed in this case).
      corner_ = corner_table_->SwingRight(corner_);
    }
  }